

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O2

void ZCC_InitOperators(void)

{
  int iVar1;
  long lVar2;
  
  if (ZCC_InitOperators()::UnaryOpInit == '\0') {
    iVar1 = __cxa_guard_acquire(&ZCC_InitOperators()::UnaryOpInit);
    if (iVar1 != 0) {
      ZCC_InitOperators::UnaryOpInit[0].Op = PEX_PostInc;
      ZCC_InitOperators::UnaryOpInit[0].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[1].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[1].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[2].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[2].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[3].Op = PEX_PostDec;
      ZCC_InitOperators::UnaryOpInit[3].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[3].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[4].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[4].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[5].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[5].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[6].Op = PEX_PreInc;
      ZCC_InitOperators::UnaryOpInit[6].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[6].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[7].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[7].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[8].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[8].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[9].Op = PEX_PreDec;
      ZCC_InitOperators::UnaryOpInit[9].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[9].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[10].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[10].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[0xb].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[0xb].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[0xc].Op = PEX_Negate;
      ZCC_InitOperators::UnaryOpInit[0xc].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0xc].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[0xd].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[0xd].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[0xe].Op = PEX_AntiNegate;
      ZCC_InitOperators::UnaryOpInit[0xe].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0xe].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[0xf].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[0xf].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[0x10].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[0x10].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[0x11].Op = PEX_BitNot;
      ZCC_InitOperators::UnaryOpInit[0x11].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0x11].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[0x12].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[0x12].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[0x13].Op = PEX_BoolNot;
      ZCC_InitOperators::UnaryOpInit[0x13].Type = (PType **)&TypeBool;
      ZCC_InitOperators::UnaryOpInit[0x13].EvalConst =
           ZCC_InitOperators::anon_class_1_0_00000001::__invoke<ZCC_ExprConstant>;
      ZCC_InitOperators::UnaryOpInit[1].Op = ZCC_InitOperators::UnaryOpInit[0].Op;
      ZCC_InitOperators::UnaryOpInit[2].Op = ZCC_InitOperators::UnaryOpInit[0].Op;
      ZCC_InitOperators::UnaryOpInit[4].Op = ZCC_InitOperators::UnaryOpInit[3].Op;
      ZCC_InitOperators::UnaryOpInit[5].Op = ZCC_InitOperators::UnaryOpInit[3].Op;
      ZCC_InitOperators::UnaryOpInit[7].Op = ZCC_InitOperators::UnaryOpInit[6].Op;
      ZCC_InitOperators::UnaryOpInit[8].Op = ZCC_InitOperators::UnaryOpInit[6].Op;
      ZCC_InitOperators::UnaryOpInit[10].Op = ZCC_InitOperators::UnaryOpInit[9].Op;
      ZCC_InitOperators::UnaryOpInit[0xb].Op = ZCC_InitOperators::UnaryOpInit[9].Op;
      ZCC_InitOperators::UnaryOpInit[0xd].Op = ZCC_InitOperators::UnaryOpInit[0xc].Op;
      ZCC_InitOperators::UnaryOpInit[0xf].Op = ZCC_InitOperators::UnaryOpInit[0xe].Op;
      ZCC_InitOperators::UnaryOpInit[0x10].Op = ZCC_InitOperators::UnaryOpInit[0xe].Op;
      ZCC_InitOperators::UnaryOpInit[0x12].Op = ZCC_InitOperators::UnaryOpInit[0x11].Op;
      __cxa_guard_release(&ZCC_InitOperators()::UnaryOpInit);
    }
  }
  for (lVar2 = 0x10; lVar2 != 0x1f0; lVar2 = lVar2 + 0x18) {
    ZCC_OpInfoType::AddProto
              (ZCC_OpInfo + *(uint *)(&ProtoFreeer + lVar2),
               (PType *)**(undefined8 **)(lVar2 + 0xa15568),
               (PType *)**(undefined8 **)(lVar2 + 0xa15568),
               *(EvalConst1op *)((long)&ZCC_InitOperators::UnaryOpInit[0].Op + lVar2));
  }
  if (ZCC_InitOperators()::BinaryOpInit == '\0') {
    iVar1 = __cxa_guard_acquire(&ZCC_InitOperators()::BinaryOpInit);
    if (iVar1 != 0) {
      ZCC_InitOperators::BinaryOpInit[0].Op = PEX_Add;
      ZCC_InitOperators::BinaryOpInit[0].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0].EvalConst =
           auto_ZCC_InitOperators()::$_11::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[1].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[1].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[1].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[1].EvalConst =
           auto_ZCC_InitOperators()::$_12::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[2].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[2].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[2].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[2].EvalConst =
           auto_ZCC_InitOperators()::$_13::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[3].Op = PEX_Sub;
      ZCC_InitOperators::BinaryOpInit[3].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[3].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[3].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[3].EvalConst =
           auto_ZCC_InitOperators()::$_14::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[4].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[4].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[4].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[4].EvalConst =
           auto_ZCC_InitOperators()::$_15::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[5].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[5].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[5].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[5].EvalConst =
           auto_ZCC_InitOperators()::$_16::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[6].Op = PEX_Mul;
      ZCC_InitOperators::BinaryOpInit[6].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[6].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[6].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[6].EvalConst =
           auto_ZCC_InitOperators()::$_17::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[7].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[7].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[7].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[7].EvalConst =
           auto_ZCC_InitOperators()::$_18::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[8].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[8].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[8].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[8].EvalConst =
           auto_ZCC_InitOperators()::$_19::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[9].Op = PEX_Div;
      ZCC_InitOperators::BinaryOpInit[9].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[9].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[9].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[9].EvalConst =
           auto_ZCC_InitOperators()::$_20::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[10].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[10].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[10].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[10].EvalConst =
           auto_ZCC_InitOperators()::$_21::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0xb].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xb].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xb].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xb].EvalConst =
           auto_ZCC_InitOperators()::$_22::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0xc].Op = PEX_Mod;
      ZCC_InitOperators::BinaryOpInit[0xc].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0xc].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0xc].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0xc].EvalConst =
           auto_ZCC_InitOperators()::$_23::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0xd].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0xd].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0xd].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0xd].EvalConst =
           auto_ZCC_InitOperators()::$_24::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0xe].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xe].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xe].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xe].EvalConst =
           auto_ZCC_InitOperators()::$_25::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0xf].Op = PEX_Pow;
      ZCC_InitOperators::BinaryOpInit[0xf].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xf].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xf].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xf].EvalConst =
           auto_ZCC_InitOperators()::$_26::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x10].Op = PEX_Concat;
      ZCC_InitOperators::BinaryOpInit[0x10].Res = (PType **)&TypeString;
      ZCC_InitOperators::BinaryOpInit[0x10].Ltype = (PType **)&TypeString;
      ZCC_InitOperators::BinaryOpInit[0x10].Rtype = (PType **)&TypeString;
      ZCC_InitOperators::BinaryOpInit[0x10].EvalConst = EvalConcat;
      ZCC_InitOperators::BinaryOpInit[0x11].Op = PEX_BitAnd;
      ZCC_InitOperators::BinaryOpInit[0x11].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x11].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x11].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x11].EvalConst =
           auto_ZCC_InitOperators()::$_27::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x12].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x12].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x12].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x12].EvalConst =
           auto_ZCC_InitOperators()::$_28::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x13].Op = PEX_BitOr;
      ZCC_InitOperators::BinaryOpInit[0x13].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x13].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x13].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x13].EvalConst =
           auto_ZCC_InitOperators()::$_29::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x14].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x14].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x14].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x14].EvalConst =
           auto_ZCC_InitOperators()::$_30::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x15].Op = PEX_BitXor;
      ZCC_InitOperators::BinaryOpInit[0x15].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x15].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x15].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x15].EvalConst =
           auto_ZCC_InitOperators()::$_31::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x16].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x16].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x16].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x16].EvalConst =
           auto_ZCC_InitOperators()::$_32::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x17].Op = PEX_BoolAnd;
      ZCC_InitOperators::BinaryOpInit[0x17].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x17].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x17].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x17].EvalConst =
           auto_ZCC_InitOperators()::$_33::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x18].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x18].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x18].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x18].EvalConst =
           auto_ZCC_InitOperators()::$_34::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x19].Op = PEX_BoolOr;
      ZCC_InitOperators::BinaryOpInit[0x19].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x19].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x19].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x19].EvalConst =
           auto_ZCC_InitOperators()::$_35::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x1a].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1a].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1a].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1a].EvalConst =
           auto_ZCC_InitOperators()::$_36::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x1b].Op = PEX_LeftShift;
      ZCC_InitOperators::BinaryOpInit[0x1b].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1b].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1b].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1b].EvalConst =
           auto_ZCC_InitOperators()::$_37::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x1c].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1c].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1c].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1c].EvalConst =
           auto_ZCC_InitOperators()::$_38::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x1d].Op = PEX_RightShift;
      ZCC_InitOperators::BinaryOpInit[0x1d].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1d].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1d].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1d].EvalConst =
           auto_ZCC_InitOperators()::$_39::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x1e].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1e].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1e].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1e].EvalConst =
           auto_ZCC_InitOperators()::$_40::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x1f].Op = PEX_LT;
      ZCC_InitOperators::BinaryOpInit[0x1f].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x1f].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1f].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1f].EvalConst =
           auto_ZCC_InitOperators()::$_41::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x20].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x20].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x20].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x20].EvalConst =
           auto_ZCC_InitOperators()::$_42::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x21].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x21].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x21].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x21].EvalConst =
           auto_ZCC_InitOperators()::$_43::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x22].Op = PEX_LTEQ;
      ZCC_InitOperators::BinaryOpInit[0x22].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x22].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x22].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x22].EvalConst =
           auto_ZCC_InitOperators()::$_44::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x23].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x23].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x23].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x23].EvalConst =
           auto_ZCC_InitOperators()::$_45::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x24].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x24].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x24].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x24].EvalConst =
           auto_ZCC_InitOperators()::$_46::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x25].Op = PEX_EQEQ;
      ZCC_InitOperators::BinaryOpInit[0x25].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x25].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x25].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x25].EvalConst =
           auto_ZCC_InitOperators()::$_47::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x26].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x26].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x26].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x26].EvalConst =
           auto_ZCC_InitOperators()::$_48::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x27].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x27].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x27].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x27].EvalConst =
           auto_ZCC_InitOperators()::$_49::
           __invoke<ZCC_ExprConstant,ZCC_ExprConstant,FSharedStringArena>;
      ZCC_InitOperators::BinaryOpInit[0x28].Op = PEX_LTGTEQ;
      ZCC_InitOperators::BinaryOpInit[0x28].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x28].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x28].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x28].EvalConst = EvalLTGTEQSInt32;
      ZCC_InitOperators::BinaryOpInit[0x29].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x29].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x29].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x29].EvalConst = EvalLTGTEQUInt32;
      ZCC_InitOperators::BinaryOpInit[0x2a].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x2a].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x2a].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x2a].EvalConst = EvalLTGTEQFloat64;
      ZCC_InitOperators::BinaryOpInit[1].Op = ZCC_InitOperators::BinaryOpInit[0].Op;
      ZCC_InitOperators::BinaryOpInit[2].Op = ZCC_InitOperators::BinaryOpInit[0].Op;
      ZCC_InitOperators::BinaryOpInit[4].Op = ZCC_InitOperators::BinaryOpInit[3].Op;
      ZCC_InitOperators::BinaryOpInit[5].Op = ZCC_InitOperators::BinaryOpInit[3].Op;
      ZCC_InitOperators::BinaryOpInit[7].Op = ZCC_InitOperators::BinaryOpInit[6].Op;
      ZCC_InitOperators::BinaryOpInit[8].Op = ZCC_InitOperators::BinaryOpInit[6].Op;
      ZCC_InitOperators::BinaryOpInit[10].Op = ZCC_InitOperators::BinaryOpInit[9].Op;
      ZCC_InitOperators::BinaryOpInit[0xb].Op = ZCC_InitOperators::BinaryOpInit[9].Op;
      ZCC_InitOperators::BinaryOpInit[0xd].Op = ZCC_InitOperators::BinaryOpInit[0xc].Op;
      ZCC_InitOperators::BinaryOpInit[0xe].Op = ZCC_InitOperators::BinaryOpInit[0xc].Op;
      ZCC_InitOperators::BinaryOpInit[0x12].Op = ZCC_InitOperators::BinaryOpInit[0x11].Op;
      ZCC_InitOperators::BinaryOpInit[0x14].Op = ZCC_InitOperators::BinaryOpInit[0x13].Op;
      ZCC_InitOperators::BinaryOpInit[0x16].Op = ZCC_InitOperators::BinaryOpInit[0x15].Op;
      ZCC_InitOperators::BinaryOpInit[0x18].Op = ZCC_InitOperators::BinaryOpInit[0x17].Op;
      ZCC_InitOperators::BinaryOpInit[0x1a].Op = ZCC_InitOperators::BinaryOpInit[0x19].Op;
      ZCC_InitOperators::BinaryOpInit[0x1c].Op = ZCC_InitOperators::BinaryOpInit[0x1b].Op;
      ZCC_InitOperators::BinaryOpInit[0x1e].Op = ZCC_InitOperators::BinaryOpInit[0x1d].Op;
      ZCC_InitOperators::BinaryOpInit[0x20].Op = ZCC_InitOperators::BinaryOpInit[0x1f].Op;
      ZCC_InitOperators::BinaryOpInit[0x21].Op = ZCC_InitOperators::BinaryOpInit[0x1f].Op;
      ZCC_InitOperators::BinaryOpInit[0x23].Op = ZCC_InitOperators::BinaryOpInit[0x22].Op;
      ZCC_InitOperators::BinaryOpInit[0x24].Op = ZCC_InitOperators::BinaryOpInit[0x22].Op;
      ZCC_InitOperators::BinaryOpInit[0x26].Op = ZCC_InitOperators::BinaryOpInit[0x25].Op;
      ZCC_InitOperators::BinaryOpInit[0x27].Op = ZCC_InitOperators::BinaryOpInit[0x25].Op;
      ZCC_InitOperators::BinaryOpInit[0x29].Op = ZCC_InitOperators::BinaryOpInit[0x28].Op;
      ZCC_InitOperators::BinaryOpInit[0x2a].Op = ZCC_InitOperators::BinaryOpInit[0x28].Op;
      __cxa_guard_release(&ZCC_InitOperators()::BinaryOpInit);
    }
  }
  for (lVar2 = 0x20; lVar2 != 0x6d8; lVar2 = lVar2 + 0x28) {
    ZCC_OpInfoType::AddProto
              (ZCC_OpInfo + *(uint *)((long)&ZCC_InitOperators::UnaryOpInit[0x13].Type + lVar2),
               (PType *)**(undefined8 **)
                          ((long)&ZCC_InitOperators::UnaryOpInit[0x13].EvalConst + lVar2),
               (PType *)**(undefined8 **)(&ZCC_InitOperators()::UnaryOpInit + lVar2),
               (PType *)**(undefined8 **)(lVar2 + 0xa15758),
               *(EvalConst2op *)((long)&ZCC_InitOperators::BinaryOpInit[0].Op + lVar2));
  }
  return;
}

Assistant:

void ZCC_InitOperators()
{
	// Prototypes are added from lowest to highest conversion precedence.

	// Unary operators
	static const OpProto1 UnaryOpInit[] =
	{
		{ PEX_PostInc	 , (PType **)&TypeSInt32,  EvalIdentity },
		{ PEX_PostInc	 , (PType **)&TypeUInt32,  EvalIdentity },
		{ PEX_PostInc	 , (PType **)&TypeFloat64, EvalIdentity },

		{ PEX_PostDec	 , (PType **)&TypeSInt32,  EvalIdentity },
		{ PEX_PostDec	 , (PType **)&TypeUInt32,  EvalIdentity },
		{ PEX_PostDec	 , (PType **)&TypeFloat64, EvalIdentity },

		{ PEX_PreInc	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal += 1; return val; } },
		{ PEX_PreInc	 , (PType **)&TypeUInt32,  [](auto *val) { val->UIntVal += 1; return val; } },
		{ PEX_PreInc	 , (PType **)&TypeFloat64, [](auto *val) { val->DoubleVal += 1; return val; } },

		{ PEX_PreDec	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal -= 1; return val; } },
		{ PEX_PreDec	 , (PType **)&TypeUInt32,  [](auto *val) { val->UIntVal -= 1; return val; } },
		{ PEX_PreDec	 , (PType **)&TypeFloat64, [](auto *val) { val->DoubleVal -= 1; return val; } },

		{ PEX_Negate	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal = -val->IntVal; return val; } },
		{ PEX_Negate	 , (PType **)&TypeFloat64, [](auto *val) { val->DoubleVal = -val->DoubleVal; return val; } },

		{ PEX_AntiNegate , (PType **)&TypeSInt32,  EvalIdentity },
		{ PEX_AntiNegate , (PType **)&TypeUInt32,  EvalIdentity },
		{ PEX_AntiNegate , (PType **)&TypeFloat64, EvalIdentity },

		{ PEX_BitNot	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal = ~val->IntVal; return val; } },
		{ PEX_BitNot	 , (PType **)&TypeUInt32,  [](auto *val) { val->UIntVal = ~val->UIntVal; return val; } },

		{ PEX_BoolNot	 , (PType **)&TypeBool,    [](auto *val) { val->IntVal = !val->IntVal; return val; } },
	};
	for (size_t i = 0; i < countof(UnaryOpInit); ++i)
	{
		ZCC_OpInfo[UnaryOpInit[i].Op].AddProto(*UnaryOpInit[i].Type, *UnaryOpInit[i].Type, UnaryOpInit[i].EvalConst);
	}

	// Binary operators
	static const OpProto2 BinaryOpInit[] =
	{
		{ PEX_Add		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal += r->IntVal; return l; } },
		{ PEX_Add		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal += r->UIntVal; return l; } },
		{ PEX_Add		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal += r->DoubleVal; return l; } },

		{ PEX_Sub		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal -= r->IntVal; return l; } },
		{ PEX_Sub		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal -= r->UIntVal; return l; } },
		{ PEX_Sub		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal -= r->DoubleVal; return l; } },

		{ PEX_Mul		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal *= r->IntVal; return l; } },
		{ PEX_Mul		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal *= r->UIntVal; return l; } },
		{ PEX_Mul		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal *= r->DoubleVal; return l; } },

		{ PEX_Div		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal /= r->IntVal; return l; } },
		{ PEX_Div		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal /= r->UIntVal; return l; } },
		{ PEX_Div		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal /= r->DoubleVal; return l; } },

		{ PEX_Mod		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal %= r->IntVal; return l; } },
		{ PEX_Mod		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal %= r->UIntVal; return l; } },
		{ PEX_Mod		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal = luai_nummod(l->DoubleVal, r->DoubleVal); return l; } },

		{ PEX_Pow		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal = pow(l->DoubleVal, r->DoubleVal); return l; } },

		{ PEX_Concat	 , (PType **)&TypeString,  (PType **)&TypeString,  (PType **)&TypeString,  EvalConcat },

		{ PEX_BitAnd	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal &= r->IntVal; return l; } },
		{ PEX_BitAnd	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal &= r->UIntVal; return l; } },

		{ PEX_BitOr		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal |= r->IntVal; return l; } },
		{ PEX_BitOr		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal |= r->UIntVal; return l; } },

		{ PEX_BitXor	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal ^= r->IntVal; return l; } },
		{ PEX_BitXor	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal ^= r->UIntVal; return l; } },

		{ PEX_BoolAnd	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal && r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_BoolAnd	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal && r->UIntVal; l->Type = TypeBool; return l;  } },

		{ PEX_BoolOr	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal || r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_BoolOr	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal || r->UIntVal; l->Type = TypeBool; return l; } },

		{ PEX_LeftShift  , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal <<= r->UIntVal; return l; } },
		{ PEX_LeftShift  , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal <<= r->UIntVal; return l; } },

		{ PEX_RightShift , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal >>= r->UIntVal; return l; } },
		{ PEX_RightShift , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal >>= r->UIntVal; return l; } },

		{ PEX_LT		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal < r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_LT		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal < r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_LT		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal < r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_LTEQ		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal <= r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_LTEQ		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal <= r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_LTEQ		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal <= r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_EQEQ		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal == r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_EQEQ		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal == r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_EQEQ		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal == r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_LTGTEQ	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  EvalLTGTEQSInt32 },
		{ PEX_LTGTEQ	 , (PType **)&TypeSInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  EvalLTGTEQUInt32 },
		{ PEX_LTGTEQ	 , (PType **)&TypeSInt32,  (PType **)&TypeFloat64, (PType **)&TypeFloat64, EvalLTGTEQFloat64 },
	};
	for (size_t i = 0; i < countof(BinaryOpInit); ++i)
	{
		ZCC_OpInfo[BinaryOpInit[i].Op].AddProto(*BinaryOpInit[i].Res, *BinaryOpInit[i].Ltype, *BinaryOpInit[i].Rtype, BinaryOpInit[i].EvalConst);
	}
}